

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::maybeStartDrag(QAbstractItemViewPrivate *this,QPoint eventPosition)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  QAbstractItemView *this_00;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QPoint topLeft;
  State in_stack_ffffffffffffff8c;
  QPoint *this_01;
  undefined1 local_40 [24];
  QPoint local_28;
  QPoint local_20;
  QPoint local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_18 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = &in_RDI->pressedPosition;
  local_20 = offset((QAbstractItemViewPrivate *)this_01);
  local_18 = ::operator-(this_01,(QPoint *)in_RDI);
  local_28 = ::operator-(this_01,(QPoint *)in_RDI);
  iVar1 = QPoint::manhattanLength(this_01);
  iVar2 = QApplication::startDragDistance();
  if (iVar2 < iVar1) {
    QModelIndex::QModelIndex((QModelIndex *)0x80529c);
    QPersistentModelIndex::operator=(&in_RDI->pressedIndex,(QModelIndex *)local_40);
    uVar3 = (**(code **)(*(long *)in_RDI->model + 0xf0))();
    (**(code **)(*(long *)&(this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f0))
              (this_00,uVar3);
    QAbstractItemView::setState(this_00,in_stack_ffffffffffffff8c);
    QAbstractItemView::stopAutoScroll((QAbstractItemView *)0x8052fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::maybeStartDrag(QPoint eventPosition)
{
    Q_Q(QAbstractItemView);

    const QPoint topLeft = pressedPosition - offset();
    if ((topLeft - eventPosition).manhattanLength() > QApplication::startDragDistance()) {
        pressedIndex = QModelIndex();
        q->startDrag(model->supportedDragActions());
        q->setState(QAbstractItemView::NoState); // the startDrag will return when the dnd operation
                                                 // is done
        q->stopAutoScroll();
    }
}